

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::Next
          (CopyingOutputStreamAdaptor *this,void **data,int *size)

{
  bool bVar1;
  int iVar2;
  pointer __old_p;
  uchar *puVar3;
  int iVar4;
  
  iVar4 = this->buffer_size_;
  if (this->buffer_used_ == iVar4) {
    bVar1 = WriteBuffer(this);
    if (!bVar1) {
      return false;
    }
    iVar4 = this->buffer_size_;
  }
  puVar3 = (this->buffer_)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar3 == (uchar *)0x0) {
    iVar2 = -1;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
    puVar3 = (uchar *)operator_new__((long)iVar2);
    (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
    ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar3;
  }
  iVar2 = this->buffer_used_;
  *data = puVar3 + iVar2;
  *size = iVar4 - iVar2;
  this->buffer_used_ = this->buffer_size_;
  return true;
}

Assistant:

bool CopyingOutputStreamAdaptor::Next(void** data, int* size) {
  if (buffer_used_ == buffer_size_) {
    if (!WriteBuffer()) return false;
  }

  AllocateBufferIfNeeded();

  *data = buffer_.get() + buffer_used_;
  *size = buffer_size_ - buffer_used_;
  buffer_used_ = buffer_size_;
  return true;
}